

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O3

void __thiscall Map::SpellGroup(Map *this,Character *from,unsigned_short spell_id)

{
  unsigned_short uVar1;
  World *pWVar2;
  Character *this_00;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ESF_Data *pEVar6;
  mapped_type *pmVar7;
  _Rb_tree_node_base *p_Var8;
  short sVar9;
  undefined6 in_register_00000012;
  ushort uVar10;
  _List_node_base *p_Var11;
  list<Character_*,_std::allocator<Character_*>_> *__range2;
  int iVar12;
  unsigned_short num;
  pointer ppCVar13;
  Character *character;
  set<Character_*,_std::less<Character_*>,_std::allocator<Character_*>_> in_range;
  PacketBuilder builder;
  key_type local_c8;
  Character *local_a8;
  undefined1 local_a0 [32];
  _Rb_tree_node_base *local_80;
  size_t local_78;
  ESF_Data *local_70;
  pointer local_68;
  PacketBuilder local_60;
  
  pEVar6 = ESF::Get(from->world->esf,(uint)CONCAT62(in_register_00000012,spell_id));
  if (pEVar6->id == 0) {
    return;
  }
  if (pEVar6->type != Heal) {
    return;
  }
  if (from->party == (Party *)0x0) {
    return;
  }
  if (from->tp < pEVar6->tp) {
    return;
  }
  from->tp = from->tp - pEVar6->tp;
  uVar1 = pEVar6->hp;
  num = uVar1;
  local_a8 = from;
  if ((from->nointeract & 4U) == 0) goto LAB_0015ac53;
  if ((from->nointeract & 0x20U) == 0) {
    if (from->map->pk != false) goto LAB_0015ac53;
    pWVar2 = this->world;
    local_a0._0_8_ = local_a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"GlobalPK","");
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pWVar2->config,(key_type *)local_a0);
    from = local_a8;
    bVar3 = util::variant::GetBool(pmVar7);
    bVar4 = true;
    if (bVar3) {
      bVar4 = World::PKExcept(this->world,(int)this->id);
    }
    if ((undefined1 *)local_a0._0_8_ != local_a0 + 0x10) {
      operator_delete((void *)local_a0._0_8_,local_a0._16_8_ + 1);
    }
    if (bVar4 == false) goto LAB_0015ac53;
  }
  num = 1;
  if ((short)uVar1 < 1) {
    num = uVar1;
  }
LAB_0015ac53:
  local_a0._24_8_ = local_a0 + 8;
  local_a0._8_4_ = _S_red;
  local_a0._16_8_ = 0;
  local_78 = 0;
  local_80 = (_Rb_tree_node_base *)local_a0._24_8_;
  PacketBuilder::PacketBuilder
            (&local_60,PACKET_SPELL,PACKET_TARGET_GROUP,
             ((long)(from->party->members).
                    super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(from->party->members).
                    super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * 10 + 8);
  PacketBuilder::AddShort(&local_60,spell_id);
  PacketBuilder::AddShort(&local_60,(unsigned_short)from->player->id);
  PacketBuilder::AddShort(&local_60,from->tp);
  PacketBuilder::AddShort(&local_60,num);
  ppCVar13 = (from->party->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  local_68 = (from->party->members).super__Vector_base<Character_*,_std::allocator<Character_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (ppCVar13 != local_68) {
    local_70 = pEVar6;
    do {
      this_00 = *ppCVar13;
      if (this_00->map == from->map) {
        iVar12 = (int)pEVar6->hp;
        pWVar2 = this->world;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"LimitDamage","");
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pWVar2->config,&local_c8);
        bVar3 = util::variant::GetBool(pmVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if ((bVar3) && (iVar5 = (int)this_00->maxhp - (int)this_00->hp, iVar5 < iVar12)) {
          iVar12 = iVar5;
        }
        uVar10 = 0;
        if (0 < iVar12) {
          uVar10 = (ushort)iVar12;
        }
        if ((local_a8->nointeract & 4U) != 0) {
          if ((local_a8->nointeract & 0x20U) == 0) {
            if (local_a8->map->pk == false) {
              pWVar2 = this->world;
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"GlobalPK","");
              pmVar7 = std::__detail::
                       _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&pWVar2->config,&local_c8);
              bVar3 = util::variant::GetBool(pmVar7);
              bVar4 = true;
              if (bVar3) {
                bVar4 = World::PKExcept(this->world,(int)this->id);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
              if (bVar4 != false) goto LAB_0015ae77;
            }
          }
          else {
LAB_0015ae77:
            uVar10 = (ushort)(0 < iVar12);
          }
        }
        this_00->hp = this_00->hp + uVar10;
        pWVar2 = this->world;
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"LimitDamage","");
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&pWVar2->config,&local_c8);
        pEVar6 = local_70;
        bVar3 = util::variant::GetBool(pmVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if (!bVar3) {
          sVar9 = this_00->hp;
          if (this_00->maxhp < this_00->hp) {
            sVar9 = this_00->maxhp;
          }
          this_00->hp = sVar9;
        }
        PacketBuilder::AddByte(&local_60,0xff);
        from = local_a8;
        PacketBuilder::AddByte(&local_60,0xff);
        PacketBuilder::AddByte(&local_60,0xff);
        PacketBuilder::AddByte(&local_60,0xff);
        PacketBuilder::AddByte(&local_60,0xff);
        PacketBuilder::AddShort(&local_60,(unsigned_short)this_00->player->id);
        iVar12 = (int)(((double)(int)this_00->hp / (double)(int)this_00->maxhp) * 100.0);
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        if (99 < iVar12) {
          iVar12 = 100;
        }
        PacketBuilder::AddChar(&local_60,(uchar)iVar12);
        PacketBuilder::AddShort(&local_60,this_00->hp);
        for (p_Var11 = (this->characters).
                       super__List_base<Character_*,_std::allocator<Character_*>_>._M_impl._M_node.
                       super__List_node_base._M_next;
            p_Var11 != (_List_node_base *)&this->characters; p_Var11 = p_Var11->_M_next) {
          local_c8._M_dataplus._M_p = (pointer)p_Var11[1]._M_next;
          if (((this_00->nowhere == false) &&
              (*(char *)((long)&((_List_node_base *)local_c8._M_dataplus._M_p)->_M_prev + 5) == '\0'
              )) && (bVar3 = Character::InRange(this_00,*(uchar *)&((_List_node_base *)
                                                                   ((long)local_c8._M_dataplus._M_p
                                                                   + 0xc0))->_M_next,
                                                *(uchar *)((long)local_c8._M_dataplus._M_p + 0xc0U +
                                                          1)), bVar3)) {
            std::
            _Rb_tree<Character*,Character*,std::_Identity<Character*>,std::less<Character*>,std::allocator<Character*>>
            ::_M_insert_unique<Character*const&>
                      ((_Rb_tree<Character*,Character*,std::_Identity<Character*>,std::less<Character*>,std::allocator<Character*>>
                        *)local_a0,(Character **)&local_c8);
          }
        }
      }
      ppCVar13 = ppCVar13 + 1;
    } while (ppCVar13 != local_68);
  }
  if ((_Rb_tree_node_base *)local_a0._24_8_ != (_Rb_tree_node_base *)(local_a0 + 8)) {
    p_Var8 = (_Rb_tree_node_base *)local_a0._24_8_;
    do {
      EOClient::Send(*(EOClient **)(*(long *)(*(long *)(p_Var8 + 1) + 0x3e0) + 0x78),&local_60);
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while (p_Var8 != (_Rb_tree_node_base *)(local_a0 + 8));
  }
  PacketBuilder::~PacketBuilder(&local_60);
  std::
  _Rb_tree<Character_*,_Character_*,_std::_Identity<Character_*>,_std::less<Character_*>,_std::allocator<Character_*>_>
  ::~_Rb_tree((_Rb_tree<Character_*,_Character_*,_std::_Identity<Character_*>,_std::less<Character_*>,_std::allocator<Character_*>_>
               *)local_a0);
  return;
}

Assistant:

void Map::SpellGroup(Character *from, unsigned short spell_id)
{
	const ESF_Data &spell = from->world->esf->Get(spell_id);

	if (!spell || spell.type != ESF::Heal || !from->party || from->tp < spell.tp)
		return;

	from->tp -= spell.tp;

	int displayhp = spell.hp;

	if (!from->CanInteractCombat() && !(from->CanInteractPKCombat() && (from->map->pk || (this->world->config["GlobalPK"] && !this->world->PKExcept(this->id)))))
	{
		displayhp = std::min(displayhp, 1);
	}

	std::set<Character *> in_range;

	PacketBuilder builder(PACKET_SPELL, PACKET_TARGET_GROUP, 8 + from->party->members.size() * 10);
	builder.AddShort(spell_id);
	builder.AddShort(from->PlayerID());
	builder.AddShort(from->tp);
	builder.AddShort(displayhp);

	UTIL_FOREACH(from->party->members, member)
	{
		if (member->map != from->map)
			continue;

		int displayhp = spell.hp;
		int hpgain = spell.hp;

		if (this->world->config["LimitDamage"])
			hpgain = std::min(hpgain, member->maxhp - member->hp);

		hpgain = std::max(hpgain, 0);

		if (!from->CanInteractCombat() && !(from->CanInteractPKCombat() && (from->map->pk || (this->world->config["GlobalPK"] && !this->world->PKExcept(this->id)))))
			hpgain = std::min(hpgain, 1);

		member->hp += hpgain;

		if (!this->world->config["LimitDamage"])
			member->hp = std::min(member->hp, member->maxhp);

		// wat?
		builder.AddByte(255);
		builder.AddByte(255);
		builder.AddByte(255);
		builder.AddByte(255);
		builder.AddByte(255);

		builder.AddShort(member->PlayerID());
		builder.AddChar(util::clamp<int>(double(member->hp) / double(member->maxhp) * 100.0, 0, 100));
		builder.AddShort(member->hp);

		UTIL_FOREACH(this->characters, character)
		{
			if (member->InRange(character))
				in_range.insert(character);
		}
	}

	UTIL_FOREACH(in_range, character)
	{
		character->Send(builder);
	}
}